

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::InsertStore(LinearScan *this,Instr *instr,StackSym *sym,RegNum reg)

{
  IRType type;
  code *pcVar1;
  bool bVar2;
  OpCode opcode;
  uint32 number;
  uint uVar3;
  uint functionId;
  undefined4 *puVar4;
  SymOpnd *dstOpnd;
  RegOpnd *src1Opnd;
  Instr *instr_00;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  bVar2 = StackSym::IsConst(sym);
  if ((bVar2) && (bVar2 = IsSymNonTempLocalVar(this,sym), !bVar2)) {
    if (((sym->field_5).m_instrDef)->m_next == (Instr *)0x0) {
      return;
    }
    IR::Instr::Unlink((sym->field_5).m_instrDef);
    ((sym->field_5).m_instrDef)->m_next = (Instr *)0x0;
    return;
  }
  if (reg == RegNOREG) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xc7a,"(reg != RegNOREG)","reg != RegNOREG");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  type = sym->m_type;
  opcode = LowererMDArch::GetAssignOp(type);
  dstOpnd = IR::SymOpnd::New(&sym->super_Sym,type,this->func);
  src1Opnd = IR::RegOpnd::New(sym,reg,type,this->func);
  instr_00 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->func);
  IR::Instr::InsertAfter(instr,instr_00);
  number = IR::Instr::GetNumber(instr);
  IR::Instr::SetNumber(instr_00,number);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,LinearScanPhase,uVar3,functionId);
  if (!bVar2) {
    return;
  }
  Output::Print(L"...Inserting store for ");
  Sym::Dump(&sym->super_Sym,(ValueType)0x9);
  uVar3 = GetSpillCost(this,(Lifetime *)sym->scratch);
  Output::Print(L"  Cost:%d\n",(ulong)uVar3);
  return;
}

Assistant:

void
LinearScan::InsertStore(IR::Instr *instr, StackSym *sym, RegNum reg)
{
    // Win8 Bug 391484: We cannot use regOpnd->GetType() here because it
    // can lead to truncation as downstream usage of the register might be of a size
    // greater than the current use. Using RegTypes[reg] works only if the stack slot size
    // is always at least of size MachPtr

    // In the debug mode, if the current sym belongs to the byte code locals, then do not unlink this instruction, as we need to have this instruction to be there
    // to produce the write-through instruction.
    if (sym->IsConst() && !IsSymNonTempLocalVar(sym))
    {
        // Let's just delete the def.  We'll reload the constant.
        // We can't just delete the instruction however since the
        // uses will look at the def to get the value.

        // Make sure it wasn't already deleted.
        if (sym->m_instrDef->m_next)
        {
            sym->m_instrDef->Unlink();
            sym->m_instrDef->m_next = nullptr;
        }
        return;
    }

    Assert(reg != RegNOREG);

    IRType type = sym->GetType();

    IR::Instr *store = IR::Instr::New(LowererMD::GetStoreOp(type),
        IR::SymOpnd::New(sym, type, this->func),
        IR::RegOpnd::New(sym, reg, type, this->func), this->func);
    instr->InsertAfter(store);
    store->CopyNumber(instr);
    this->linearScanMD.LegalizeDef(store);

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("...Inserting store for "));
        sym->Dump();
        Output::Print(_u("  Cost:%d\n"), this->GetSpillCost(sym->scratch.linearScan.lifetime));
    }
#endif
}